

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void iqxmlrpc::http::validator::expect_continue(string *val)

{
  bool bVar1;
  Expectation_failed *this;
  locale local_38;
  undefined1 local_30 [8];
  string exp;
  string *val_local;
  
  exp.field_2._8_8_ = val;
  std::__cxx11::string::string((string *)local_30,(string *)val);
  std::locale::locale(&local_38);
  boost::algorithm::to_lower<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_38
            );
  std::locale::~locale(&local_38);
  bVar1 = boost::algorithm::starts_with<std::__cxx11::string,char[13]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     (char (*) [13])"100-continue");
  if (!bVar1) {
    this = (Expectation_failed *)__cxa_allocate_exception(0x50);
    Expectation_failed::Expectation_failed(this);
    __cxa_throw(this,&Expectation_failed::typeinfo,Expectation_failed::~Expectation_failed);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void expect_continue(const std::string& val)
{
  std::string exp(val);
  boost::to_lower(exp);

  if (!boost::starts_with(exp, "100-continue"))
    throw Expectation_failed();
}